

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.c
# Opt level: O0

bool_t memEq(void *buf1,void *buf2,size_t count)

{
  word diff;
  size_t count_local;
  void *buf2_local;
  void *buf1_local;
  
  diff = 0;
  buf2_local = buf2;
  buf1_local = buf1;
  for (count_local = count; 7 < count_local; count_local = count_local - 8) {
    diff = *buf1_local ^ *buf2_local | diff;
    buf1_local = (void *)((long)buf1_local + 8);
    buf2_local = (void *)((long)buf2_local + 8);
  }
  while (count_local != 0) {
    diff = (long)(int)(uint)(*buf1_local ^ *buf2_local) | diff;
    buf1_local = (void *)((long)buf1_local + 1);
    buf2_local = (void *)((long)buf2_local + 1);
    count_local = count_local - 1;
  }
  return (bool_t)(diff == 0);
}

Assistant:

bool_t SAFE(memEq)(const void* buf1, const void* buf2, size_t count)
{
	register word diff = 0;
	ASSERT(memIsValid(buf1, count));
	ASSERT(memIsValid(buf2, count));
	for (; count >= O_PER_W; count -= O_PER_W)
	{
		diff |= *(const word*)buf1 ^ *(const word*)buf2;
		buf1 = (const word*)buf1 + 1;
		buf2 = (const word*)buf2 + 1;
	}
	while (count--)
	{
		diff |= *(const octet*)buf1 ^ *(const octet*)buf2;
		buf1 = (const octet*)buf1 + 1;
		buf2 = (const octet*)buf2 + 1;
	}
	return wordEq(diff, 0);
}